

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh4_factory.cpp
# Opt level: O2

Accel * __thiscall
embree::BVH4Factory::BVH4Instance
          (BVH4Factory *this,Scene *scene,bool isExpensive,BuildVariant bvariant)

{
  bool bVar1;
  BVHN<4> *this_00;
  Builder *builder;
  AccelInstance *this_01;
  undefined8 *puVar2;
  GTypeMask GVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  Intersectors intersectors;
  
  this_00 = (BVHN<4> *)BVHN<4>::operator_new(0x240);
  BVHN<4>::BVHN(this_00,(PrimitiveType *)&InstancePrimitive::type,scene);
  BVH4InstanceIntersectors(&intersectors,this,this_00);
  GVar3 = (ulong)((uint)isExpensive << 0x1e) + MTY_INSTANCE_CHEAP;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (*(long *)&(scene->super_AccelN).field_0x188 + 0x330),"default");
  if (bVar1) {
    if (bvariant != STATIC) {
      if (bvariant != DYNAMIC) {
        builder = (Builder *)0x0;
        goto LAB_0040d15d;
      }
LAB_0040d148:
      builder = (*this->BVH4BuilderTwoLevelInstanceSAH)(this_00,scene,GVar3,false);
      goto LAB_0040d15d;
    }
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*(long *)&(scene->super_AccelN).field_0x188 + 0x330),"sah");
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*(long *)&(scene->super_AccelN).field_0x188 + 0x330),"dynamic");
      if (!bVar1) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
        std::operator+(&bStack_188,"unknown builder ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)&(scene->super_AccelN).field_0x188 + 0x330));
        std::operator+(&local_168,&bStack_188," for BVH4<Object>");
        *puVar2 = &PTR__rtcore_error_021d38e0;
        *(undefined4 *)(puVar2 + 1) = 2;
        std::__cxx11::string::string((string *)(puVar2 + 2),(string *)&local_168);
        __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      goto LAB_0040d148;
    }
  }
  builder = (*this->BVH4InstanceSceneBuilderSAH)(this_00,scene,GVar3);
LAB_0040d15d:
  this_01 = (AccelInstance *)Accel::operator_new(0x180);
  AccelInstance::AccelInstance(this_01,(AccelData *)this_00,builder,&intersectors);
  return &this_01->super_Accel;
}

Assistant:

Accel* BVH4Factory::BVH4Instance(Scene* scene, bool isExpensive, BuildVariant bvariant)
  {
    BVH4* accel = new BVH4(InstancePrimitive::type,scene);
    Accel::Intersectors intersectors = BVH4InstanceIntersectors(accel);
    auto gtype = isExpensive ? Geometry::MTY_INSTANCE_EXPENSIVE : Geometry::MTY_INSTANCE_CHEAP;
    // Builder* builder = BVH4InstanceSceneBuilderSAH(accel,scene,gtype);

    Builder* builder = nullptr;
    if (scene->device->object_builder == "default") {
      switch (bvariant) {
      case BuildVariant::STATIC      : builder = BVH4InstanceSceneBuilderSAH(accel,scene,gtype); break;
      case BuildVariant::DYNAMIC     : builder = BVH4BuilderTwoLevelInstanceSAH(accel,scene,gtype,false); break;
      case BuildVariant::HIGH_QUALITY: assert(false); break;
      }
    }
    else if (scene->device->object_builder == "sah") builder = BVH4InstanceSceneBuilderSAH(accel,scene,gtype);
    else if (scene->device->object_builder == "dynamic") builder = BVH4BuilderTwoLevelInstanceSAH(accel,scene,gtype,false);
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown builder "+scene->device->object_builder+" for BVH4<Object>");

    return new AccelInstance(accel,builder,intersectors);
  }